

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  uint uVar1;
  long lVar2;
  Tables *pTVar3;
  void *pvVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  uint8_t uVar7;
  FieldDescriptor FVar8;
  CppType CVar9;
  FieldDescriptor *pFVar10;
  Symbol SVar11;
  once_flag *poVar12;
  size_type sVar13;
  ExtensionRange *pEVar14;
  SymbolBase *pSVar15;
  EnumDescriptor *pEVar16;
  EnumDescriptor *pEVar17;
  PlaceholderType placeholder_type;
  undefined1 *puVar18;
  byte bVar19;
  string *this_00;
  SubstituteArg *this_01;
  char *pcVar20;
  byte bVar21;
  StringPiece value;
  ErrorLocation location;
  allocator local_281;
  string name;
  string containing_type_name;
  string error_msg;
  SubstituteArg local_210;
  string local_1e0;
  StringPiece local_1c0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(field + 0x38) == 0) {
    *(undefined1 **)(field + 0x38) = _FieldOptions_default_instance_;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  if (((proto->_has_bits_).has_bits_[0] & 2) != 0) {
    SVar11 = LookupSymbol(this,(string *)
                               ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (string *)(*(long *)(field + 8) + 0x20),PLACEHOLDER_EXTENDABLE_MESSAGE,
                          LOOKUP_ALL,true);
    if (SVar11.ptr_ == (SymbolBase *)0x0) {
LAB_00367128:
      AddNotDefinedError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE
                         ,(string *)
                          ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      return;
    }
    if ((SVar11.ptr_)->symbol_type_ == '\x01') {
      *(SymbolBase **)(field + 0x20) = SVar11.ptr_;
      pEVar14 = Descriptor::FindExtensionRangeContainingNumber
                          ((Descriptor *)SVar11.ptr_,*(int *)(field + 4));
      if ((pEVar14 == (ExtensionRange *)0x0) &&
         ((this->pool_->allow_unknown_ != true ||
          (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((ulong)(proto->extendee_).tagged_ptr_.ptr_ &
                                      0xfffffffffffffffe),"google.protobuf.bridge.MessageSet"),
          !bVar6)))) {
        lVar2 = *(long *)(field + 8);
        std::__cxx11::string::string
                  ((string *)&error_msg,"\"$0\" does not declare $1 as an extension number.",
                   (allocator *)&local_1e0);
        name._M_dataplus._M_p = *(pointer *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x20);
        name._M_string_length._0_4_ = *(undefined4 *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x28)
        ;
        strings::internal::SubstituteArg::SubstituteArg(&local_210,*(int *)(field + 4));
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        strings::Substitute(&containing_type_name,&error_msg,(SubstituteArg *)&name,&local_210,
                            &local_1b0,&local_180,&local_150,&local_60,&local_90,&local_c0,&local_f0
                            ,&local_120);
        AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,NUMBER,&containing_type_name);
        std::__cxx11::string::~string((string *)&containing_type_name);
        std::__cxx11::string::~string((string *)&error_msg);
      }
      goto LAB_00367009;
    }
    if ((SVar11.ptr_)->symbol_type_ == '\0') goto LAB_00367128;
    lVar2 = *(long *)(field + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((ulong)(proto->extendee_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_210,"\" is not a message type.");
    AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,EXTENDEE,&name);
LAB_00367b79:
    std::__cxx11::string::~string((string *)&name);
    this_01 = &local_210;
    goto LAB_00367b88;
  }
LAB_00367009:
  if (((((byte)field[1] & 0x60) != 0x20) && (((byte)field[1] & 0x10) != 0)) &&
     (*(long *)(field + 0x28) != 0)) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  uVar1 = (proto->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) == 0) {
    CVar9 = FieldDescriptor::cpp_type(field);
    if ((CVar9 == CPPTYPE_MESSAGE) ||
       (CVar9 = FieldDescriptor::cpp_type(field), CVar9 == CPPTYPE_ENUM)) {
      lVar2 = *(long *)(field + 8);
      pcVar20 = "Field with message or enum type missing type_name.";
LAB_00367074:
      location = TYPE;
LAB_00367076:
      AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,location,pcVar20);
    }
  }
  else {
    placeholder_type = uVar1 >> 3 & PLACEHOLDER_ENUM;
    if (proto->type_ == 0xe) {
      placeholder_type = PLACEHOLDER_ENUM;
    }
    if (this->pool_->enforce_weak_ == false) {
      puVar18 = (undefined1 *)proto->options_;
      if ((FieldOptions *)puVar18 == (FieldOptions *)0x0) {
        puVar18 = _FieldOptions_default_instance_;
      }
      bVar19 = ((FieldOptions *)puVar18)->weak_;
    }
    else {
      bVar19 = 0;
    }
    bVar21 = (bVar19 ^ 1) & this->pool_->lazily_build_dependencies_;
    SVar11 = LookupSymbol(this,(string *)
                               ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                          (string *)(*(long *)(field + 8) + 0x20),placeholder_type,LOOKUP_TYPES,
                          (bool)(bVar21 ^ 1));
    if ((SVar11.ptr_ == (SymbolBase *)0x0) || (uVar7 = (SVar11.ptr_)->symbol_type_, uVar7 == '\0'))
    {
      if (bVar21 != 0) {
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        poVar12 = DescriptorPool::Tables::Create<std::once_flag>(this->tables_);
        _Var5 = name._M_dataplus;
        *(once_flag **)(field + 0x18) = poVar12;
        pTVar3 = this->tables_;
        sVar13 = stringpiece_internal::StringPiece::CheckSize
                           (CONCAT44(name._M_string_length._4_4_,(undefined4)name._M_string_length))
        ;
        value.length_ = sVar13;
        value.ptr_ = _Var5._M_p;
        pcVar20 = DescriptorPool::Tables::Strdup(pTVar3,value);
        *(char **)(field + 0x30) = pcVar20;
        if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
          pcVar20 = (char *)0x0;
        }
        else {
          pTVar3 = this->tables_;
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                    (&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          pcVar20 = DescriptorPool::Tables::Strdup(pTVar3,local_1c0);
        }
        *(char **)(field + 0x40) = pcVar20;
        FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
        if (((byte)field[1] & 8) != 0) {
          DescriptorPool::Tables::AddExtension(this->tables_,field);
        }
        this_01 = (SubstituteArg *)&name;
        goto LAB_00367b88;
      }
      if (bVar19 != 0) {
        std::__cxx11::string::string
                  ((string *)&name,"google.protobuf.Empty",(allocator *)&local_210);
        SVar11 = FindSymbol(this,&name,true);
        std::__cxx11::string::~string((string *)&name);
      }
      if ((SVar11.ptr_ == (SymbolBase *)0x0) || (uVar7 = (SVar11.ptr_)->symbol_type_, uVar7 == '\0')
         ) {
        AddNotDefinedError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
                           (string *)
                           ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        return;
      }
    }
    if (((proto->_has_bits_).has_bits_[0] & 0x400) == 0) {
      if (uVar7 == '\x01') {
        FVar8 = (FieldDescriptor)0xb;
      }
      else {
        if (uVar7 != '\x04') {
          lVar2 = *(long *)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_210,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_210,"\" is not a type.");
          AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,TYPE,&name);
          goto LAB_00367b79;
        }
        FVar8 = (FieldDescriptor)0xe;
      }
      field[2] = FVar8;
    }
    CVar9 = FieldDescriptor::cpp_type(field);
    if (CVar9 == CPPTYPE_MESSAGE) {
      bVar6 = (SVar11.ptr_)->symbol_type_ == '\x01';
      pSVar15 = (SymbolBase *)0x0;
      if (bVar6) {
        pSVar15 = SVar11.ptr_;
      }
      *(SymbolBase **)(field + 0x30) = pSVar15;
      if (!bVar6) {
        lVar2 = *(long *)(field + 8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_210,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_210,"\" is not a message type.");
        AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,TYPE,&name);
        goto LAB_00367b79;
      }
      if (((byte)field[1] & 1) == 0) goto LAB_00367082;
      lVar2 = *(long *)(field + 8);
      pcVar20 = "Messages can\'t have default values.";
LAB_003677b2:
      location = DEFAULT_VALUE;
      goto LAB_00367076;
    }
    CVar9 = FieldDescriptor::cpp_type(field);
    if (CVar9 != CPPTYPE_ENUM) {
      lVar2 = *(long *)(field + 8);
      pcVar20 = "Field with primitive type has type_name.";
      goto LAB_00367074;
    }
    bVar6 = (SVar11.ptr_)->symbol_type_ != '\x04';
    pSVar15 = (SymbolBase *)0x0;
    if (!bVar6) {
      pSVar15 = SVar11.ptr_;
    }
    *(SymbolBase **)(field + 0x30) = pSVar15;
    if (bVar6) {
      lVar2 = *(long *)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210
                     ,"\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(proto->type_name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_210,"\" is not an enum type.");
      AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,TYPE,&name);
      goto LAB_00367b79;
    }
    pEVar16 = FieldDescriptor::enum_type(field);
    FVar8 = field[1];
    if (((byte)pEVar16[1] & 1) != 0) {
      FVar8 = (FieldDescriptor)((byte)FVar8 & 0xfe);
      field[1] = FVar8;
    }
    if (((byte)FVar8 & 1) == 0) {
      pEVar16 = FieldDescriptor::enum_type(field);
      if (0 < *(int *)(pEVar16 + 4)) {
        pEVar16 = FieldDescriptor::enum_type(field);
        *(undefined8 *)(field + 0x40) = *(undefined8 *)(pEVar16 + 0x28);
      }
      goto LAB_00367082;
    }
    bVar6 = io::Tokenizer::IsIdentifier
                      ((string *)
                       ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (!bVar6) {
      lVar2 = *(long *)(field + 8);
      pcVar20 = "Default value for an enum field must be an identifier.";
      goto LAB_003677b2;
    }
    pvVar4 = (proto->default_value_).tagged_ptr_.ptr_;
    pEVar16 = FieldDescriptor::enum_type(field);
    SVar11 = LookupSymbolNoPlaceholder
                       (this,(string *)((ulong)pvVar4 & 0xfffffffffffffffe),
                        (string *)(*(long *)(pEVar16 + 8) + 0x20),LOOKUP_ALL,true);
    if (SVar11.ptr_ != (SymbolBase *)0x0) {
      if ((SVar11.ptr_)->symbol_type_ != '\x05') {
        if ((SVar11.ptr_)->symbol_type_ != '\x06') goto LAB_0036786a;
        SVar11.ptr_ = SVar11.ptr_ + -1;
      }
      pEVar16 = *(EnumDescriptor **)(SVar11.ptr_ + 0x10);
      pEVar17 = FieldDescriptor::enum_type(field);
      if (pEVar16 == pEVar17) {
        *(SymbolBase **)(field + 0x40) = SVar11.ptr_;
        goto LAB_00367082;
      }
    }
LAB_0036786a:
    lVar2 = *(long *)(field + 8);
    pEVar16 = FieldDescriptor::enum_type(field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                   "Enum type \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*(long *)(pEVar16 + 8) + 0x20));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
                   "\" has no value named \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(proto->default_value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_210,"\".");
    AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,DEFAULT_VALUE,&name);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_180);
  }
LAB_00367082:
  bVar6 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (bVar6) {
    if (((byte)field[1] & 8) == 0) {
      return;
    }
    bVar6 = DescriptorPool::Tables::AddExtension(this->tables_,field);
    if (bVar6) {
      return;
    }
    pFVar10 = DescriptorPool::Tables::FindExtension
                        (this->tables_,*(Descriptor **)(field + 0x20),*(int *)(field + 4));
    if (*(long *)(field + 0x20) == 0) {
      std::__cxx11::string::string((string *)&containing_type_name,"unknown",(allocator *)&name);
    }
    else {
      std::__cxx11::string::string
                ((string *)&containing_type_name,
                 (string *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x20));
    }
    std::__cxx11::string::string
              ((string *)&local_1e0,
               "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3."
               ,&local_281);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&name,*(int *)(field + 4));
    local_210.text_ = containing_type_name._M_dataplus._M_p;
    local_210.size_ = (int)containing_type_name._M_string_length;
    local_1b0.text_ = *(char **)(*(long *)(pFVar10 + 8) + 0x20);
    local_1b0.size_ = *(int *)(*(long *)(pFVar10 + 8) + 0x28);
    local_180.text_ = *(char **)**(long **)(pFVar10 + 0x10);
    local_180.size_ = *(int *)((undefined8 *)**(long **)(pFVar10 + 0x10) + 1);
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    strings::Substitute(&error_msg,&local_1e0,(SubstituteArg *)&name,&local_210,&local_1b0,
                        &local_180,&local_150,&local_60,&local_90,&local_c0,&local_f0,&local_120);
    std::__cxx11::string::~string((string *)&local_1e0);
    AddWarning(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,NUMBER,&error_msg)
    ;
    this_00 = &error_msg;
  }
  else {
    pFVar10 = FileDescriptorTables::FindFieldByNumber
                        (this->file_tables_,*(Descriptor **)(field + 0x20),*(int *)(field + 4));
    if (*(long *)(field + 0x20) == 0) {
      std::__cxx11::string::string((string *)&containing_type_name,"unknown",(allocator *)&name);
    }
    else {
      std::__cxx11::string::string
                ((string *)&containing_type_name,
                 (string *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x20));
    }
    lVar2 = *(long *)(field + 8);
    if (((byte)field[1] & 8) == 0) {
      std::__cxx11::string::string
                ((string *)&local_1e0,
                 "Field number $0 has already been used in \"$1\" by field \"$2\".",&local_281);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&name,*(int *)(field + 4));
      local_210.text_ = containing_type_name._M_dataplus._M_p;
      local_210.size_ = (int)containing_type_name._M_string_length;
      local_1b0.text_ = (char *)**(undefined8 **)(pFVar10 + 8);
      local_1b0.size_ = *(int *)(*(undefined8 **)(pFVar10 + 8) + 1);
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      strings::Substitute(&error_msg,&local_1e0,(SubstituteArg *)&name,&local_210,&local_1b0,
                          &local_180,&local_150,&local_60,&local_90,&local_c0,&local_f0,&local_120);
      AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,NUMBER,&error_msg);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_1e0,
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 &local_281);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&name,*(int *)(field + 4));
      local_210.text_ = containing_type_name._M_dataplus._M_p;
      local_210.size_ = (int)containing_type_name._M_string_length;
      local_1b0.text_ = *(char **)(*(long *)(pFVar10 + 8) + 0x20);
      local_1b0.size_ = *(int *)(*(long *)(pFVar10 + 8) + 0x28);
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      strings::Substitute(&error_msg,&local_1e0,(SubstituteArg *)&name,&local_210,&local_1b0,
                          &local_180,&local_150,&local_60,&local_90,&local_c0,&local_f0,&local_120);
      AddError(this,(string *)(lVar2 + 0x20),&proto->super_Message,NUMBER,&error_msg);
    }
    std::__cxx11::string::~string((string *)&error_msg);
    this_00 = &local_1e0;
  }
  std::__cxx11::string::~string((string *)this_00);
  this_01 = (SubstituteArg *)&containing_type_name;
LAB_00367b88:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (field->options_ == nullptr) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      // Set of valid extension numbers for MessageSet is different (< 2^32)
      // from other extendees (< 2^29). If unknown deps are allowed, we may not
      // have that information, and wrongly deem the extension as invalid.
      auto skip_check = get_allow_unknown(pool_) &&
                        proto.extendee() == "google.protobuf.bridge.MessageSet";
      if (!skip_check) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("\"$0\" does not declare $1 as an "
                                  "extension number.",
                                  field->containing_type()->full_name(),
                                  field->number()));
      }
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO(gerbens) Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        std::string name = proto.type_name();
        field->type_once_ = tables_->Create<internal::once_flag>();
        field->type_descriptor_.lazy_type_name = tables_->Strdup(name);
        field->lazy_default_value_enum_name_ =
            proto.has_default_value() ? tables_->Strdup(proto.default_value())
                                      : nullptr;

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                         "\" has no value named \"" + proto.default_value() +
                         "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    std::string containing_type_name =
        field->containing_type() == nullptr
            ? "unknown"
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                "in \"$1\" by extension \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                "\"$1\" by field \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        std::string containing_type_name =
            field->containing_type() == nullptr
                ? "unknown"
                : field->containing_type()->full_name();
        std::string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(), containing_type_name,
            conflicting_field->full_name(), conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}